

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void rw::flipDXT5(uint8 *dst,uint8 *src,uint32 width,uint32 height)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint8 *puVar8;
  uint uVar9;
  long lVar10;
  uint8 *puVar11;
  uint8 *puVar12;
  bool bVar13;
  uint8 *local_58;
  
  uVar6 = width + 3 >> 2;
  if (height < 4) {
    if (height != 2) {
      memcpy(dst,src,(ulong)(uVar6 << 4));
      return;
    }
    lVar10 = 0;
    while (bVar13 = uVar6 != 0, uVar6 = uVar6 - 1, bVar13) {
      puVar8 = src + lVar10;
      puVar11 = dst + lVar10;
      *puVar11 = *puVar8;
      puVar11[1] = puVar8[1];
      uVar3 = *(ulong *)(puVar8 + 2);
      *(short *)(puVar11 + 6) = (short)(uVar3 >> 0x20);
      *(uint *)(puVar11 + 2) =
           ((uint)uVar3 & 0xfff) << 0xc | (uint)(uVar3 >> 0xc) & 0xfff | (uint)uVar3 & 0xff000000;
      flipBlock_half(puVar11 + 8,puVar8 + 8);
      lVar10 = lVar10 + 0x10;
    }
  }
  else {
    uVar2 = height + 3 >> 2;
    uVar4 = uVar6 * 0x10;
    puVar8 = dst + uVar4 * uVar2;
    local_58 = src;
    for (uVar9 = 0; uVar9 != uVar2; uVar9 = uVar9 + 1) {
      puVar8 = puVar8 + -(ulong)uVar4;
      puVar11 = local_58;
      puVar12 = puVar8;
      for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
        *puVar12 = *puVar11;
        puVar12[1] = puVar11[1];
        uVar3 = *(ulong *)(puVar11 + 2);
        iVar5 = 4;
        uVar1 = 0;
        while (bVar13 = iVar5 != 0, iVar5 = iVar5 + -1, bVar13) {
          uVar1 = uVar1 << 0xc | (ulong)((uint)uVar3 & 0xfff);
          uVar3 = uVar3 >> 0xc;
        }
        *(int *)(puVar12 + 2) = (int)uVar1;
        *(short *)(puVar12 + 6) = (short)(uVar1 >> 0x20);
        flipBlock(puVar12 + 8,puVar11 + 8);
        puVar11 = puVar11 + 0x10;
        puVar12 = puVar12 + 0x10;
      }
      local_58 = local_58 + uVar4;
    }
  }
  return;
}

Assistant:

void
flipDXT5(uint8 *dst, uint8 *src, uint32 width, uint32 height)
{
	int x, y;
	int bw = (width+3)/4;
	int bh = (height+3)/4;
	if(height < 4){
		// used pixels are always at the top
		// so don't swap the full 4 rows
		if(height == 2){
			uint8 *s = src;
			uint8 *d = dst;
			for(x = 0; x < bw; x++){
				flipAlphaBlock5_half(d, s);
				flipBlock_half(d+8, s+8);
				s += 16;
				d += 16;
			}
		}else
			memcpy(dst, src, 16*bw);
		return;
	}
	dst += 16*bw*bh;
	for(y = 0; y < bh; y++){
		dst -= 16*bw;
		uint8 *s = src;
		uint8 *d = dst;
		for(x = 0; x < bw; x++){
			flipAlphaBlock5(d, s);
			flipBlock(d+8, s+8);
			s += 16;
			d += 16;
		}
		src += 16*bw;
	}
}